

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O0

double c_abs(singlecomplex *z)

{
  float fVar1;
  double dVar2;
  float local_24;
  float local_20;
  float imag;
  float real;
  float temp;
  singlecomplex *z_local;
  
  local_20 = z->r;
  local_24 = z->i;
  if (local_20 < 0.0) {
    local_20 = -local_20;
  }
  fVar1 = local_20;
  if (local_24 < 0.0) {
    local_24 = -local_24;
  }
  if (local_20 < local_24) {
    local_20 = local_24;
    local_24 = fVar1;
  }
  if ((local_20 + local_24 != local_20) || (NAN(local_20 + local_24) || NAN(local_20))) {
    dVar2 = sqrt((double)((local_24 / local_20) * (local_24 / local_20)) + 1.0);
    local_20 = (float)((double)local_20 * dVar2);
  }
  z_local = (singlecomplex *)(double)local_20;
  return (double)z_local;
}

Assistant:

double c_abs(singlecomplex *z)
{
    float temp;
    float real = z->r;
    float imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}